

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

attack * attacktype_fordmg(permonst *ptr,int atyp,int dtyp)

{
  attack *paVar1;
  ulong uVar2;
  
  uVar2 = 0x10;
  do {
    if (0x27 < uVar2) {
      return (attack *)0x0;
    }
    paVar1 = (attack *)((long)&((permonst *)(ptr->mattk + -4))->mname + uVar2);
    if ((uint)paVar1->aatyp == atyp) {
      if (dtyp == -1) {
        return paVar1;
      }
      if ((uint)*(byte *)((long)ptr->mattk + (uVar2 - 0xf)) == dtyp) {
        return paVar1;
      }
    }
    uVar2 = uVar2 + 4;
  } while( true );
}

Assistant:

const struct attack *attacktype_fordmg(const struct permonst *ptr, int atyp, int dtyp)
{
    const struct attack *a;

    for (a = &ptr->mattk[0]; a < &ptr->mattk[NATTK]; a++)
	if (a->aatyp == atyp && (dtyp == AD_ANY || a->adtyp == dtyp))
	    return a;

    return NULL;
}